

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

bool __thiscall
crnlib::crn_comp::pack_color_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint *puVar2;
  unsigned_short *puVar3;
  uchar *puVar4;
  undefined8 uVar5;
  uint32 i_1;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint32 i_2;
  vector<unsigned_int> remapped_selectors;
  symbol_histogram hist;
  static_huffman_data_model dm;
  symbol_codec local_c8;
  
  vector<unsigned_int>::vector(&remapped_selectors,(this->m_color_selectors).m_size);
  puVar2 = (this->m_color_selectors).m_p;
  puVar3 = remapping->m_p;
  for (uVar6 = 0; uVar6 < (this->m_color_selectors).m_size; uVar6 = uVar6 + 1) {
    remapped_selectors.m_p[puVar3[uVar6]] = puVar2[uVar6];
  }
  vector<unsigned_int>::vector(&hist.m_hist,0x10);
  uVar7 = 0;
  for (uVar6 = 0; uVar6 < remapped_selectors.m_size; uVar6 = uVar6 + 1) {
    uVar1 = remapped_selectors.m_p[uVar6];
    uVar7 = uVar7 ^ uVar1;
    for (iVar8 = -8; iVar8 != 0; iVar8 = iVar8 + 1) {
      hist.m_hist.m_p[uVar7 & 0xf] = hist.m_hist.m_p[uVar7 & 0xf] + 1;
      uVar7 = uVar7 >> 4;
    }
    uVar7 = uVar1;
  }
  static_huffman_data_model::static_huffman_data_model(&dm);
  static_huffman_data_model::init(&dm,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec(&local_c8);
  symbol_codec::start_encoding(&local_c8,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            (&local_c8,&dm,false,(static_huffman_data_model *)0x0);
  uVar7 = 0;
  for (uVar6 = 0; uVar6 < remapped_selectors.m_size; uVar6 = uVar6 + 1) {
    uVar1 = remapped_selectors.m_p[uVar6];
    uVar7 = uVar7 ^ uVar1;
    for (iVar8 = -8; iVar8 != 0; iVar8 = iVar8 + 1) {
      symbol_codec::encode(&local_c8,uVar7 & 0xf,&dm);
      uVar7 = uVar7 >> 4;
    }
    uVar7 = uVar1;
  }
  symbol_codec::stop_encoding(&local_c8,false);
  puVar4 = packed_data->m_p;
  packed_data->m_p = local_c8.m_output_buf.m_p;
  uVar5._0_4_ = packed_data->m_size;
  uVar5._4_4_ = packed_data->m_capacity;
  packed_data->m_size = local_c8.m_output_buf.m_size;
  packed_data->m_capacity = local_c8.m_output_buf.m_capacity;
  local_c8.m_output_buf.m_p = puVar4;
  local_c8.m_output_buf._8_8_ = uVar5;
  symbol_codec::~symbol_codec(&local_c8);
  static_huffman_data_model::~static_huffman_data_model(&dm);
  vector<unsigned_int>::~vector(&hist.m_hist);
  vector<unsigned_int>::~vector(&remapped_selectors);
  return true;
}

Assistant:

bool crn_comp::pack_color_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint32> remapped_selectors(m_color_selectors.size());
        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            remapped_selectors[remapping[i]] = m_color_selectors[i];
        }
        symbol_histogram hist(16);
        for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
            {
                hist.inc_freq(selector & 0xF);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
            {
                codec.encode(selector & 0xF, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }